

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

void __thiscall
wabt::WastParser::WastParser
          (WastParser *this,WastLexer *lexer,Errors *errors,WastParseOptions *options)

{
  undefined8 *puVar1;
  long lVar2;
  
  this->lexer_ = lexer;
  this->last_module_index_ = 0xffffffff;
  this->errors_ = errors;
  this->options_ = options;
  lVar2 = 0x40;
  do {
    puVar1 = (undefined8 *)((long)(this->tokens_).contents_._M_elems + lVar2 + -0x34);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(this->tokens_).contents_._M_elems + lVar2 + -0x40);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)(this->tokens_).contents_._M_elems + lVar2 + -0x20) = 0;
    lVar2 = lVar2 + 0x50;
  } while (lVar2 != 0xe0);
  (this->tokens_).size_ = 0;
  (this->tokens_).front_ = 0;
  return;
}

Assistant:

WastParser::WastParser(WastLexer* lexer,
                       Errors* errors,
                       WastParseOptions* options)
    : lexer_(lexer), errors_(errors), options_(options) {}